

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O0

int retry_control_should_retry(RETRY_CONTROL_HANDLE retry_control_handle,RETRY_ACTION *retry_action)

{
  int iVar1;
  uint uVar2;
  LOGGER_LOG p_Var3;
  time_t tVar4;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  RETRY_CONTROL_INSTANCE *retry_control;
  LOGGER_LOG l;
  int result;
  RETRY_ACTION *retry_action_local;
  RETRY_CONTROL_HANDLE retry_control_handle_local;
  
  if ((retry_control_handle == (RETRY_CONTROL_HANDLE)0x0) || (retry_action == (RETRY_ACTION *)0x0))
  {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"retry_control_should_retry",0x15c,1,
                "Failed to evaluate if retry should be attempted (either retry_control_handle (%p) or retry_action (%p) are NULL)"
                ,retry_control_handle,retry_action);
    }
    l._4_4_ = 0x15d;
  }
  else if (retry_control_handle->policy == IOTHUB_CLIENT_RETRY_NONE) {
    *retry_action = RETRY_ACTION_STOP_RETRYING;
    l._4_4_ = 0;
  }
  else {
    if (retry_control_handle->first_retry_tick_seconds == -1) {
      tVar4 = retry_get_tick_seconds(retry_control_handle);
      retry_control_handle->first_retry_tick_seconds = tVar4;
      if (tVar4 == -1) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                    ,"retry_control_should_retry",0x16a,1,
                    "Failed to evaluate if retry should be attempted (retry_get_tick_seconds() failed)"
                   );
        }
        return 0x16b;
      }
    }
    iVar1 = evaluate_retry_action(retry_control_handle,retry_action);
    if (iVar1 == 0) {
      if ((*retry_action == RETRY_ACTION_RETRY_NOW) &&
         (retry_control_handle->retry_count = retry_control_handle->retry_count + 1,
         retry_control_handle->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE)) {
        tVar4 = retry_get_tick_seconds(retry_control_handle);
        retry_control_handle->last_retry_tick_seconds = tVar4;
        uVar2 = calculate_next_wait_time(retry_control_handle);
        retry_control_handle->current_wait_time_in_secs = uVar2;
      }
      l._4_4_ = 0;
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                  ,"retry_control_should_retry",0x16f,1,
                  "Failed to evaluate if retry should be attempted (evaluate_retry_action() failed)"
                 );
      }
      l._4_4_ = 0x170;
    }
  }
  return l._4_4_;
}

Assistant:

int retry_control_should_retry(RETRY_CONTROL_HANDLE retry_control_handle, RETRY_ACTION* retry_action)
{
    int result;

    if ((retry_control_handle == NULL) || (retry_action == NULL))
    {
        LogError("Failed to evaluate if retry should be attempted (either retry_control_handle (%p) or retry_action (%p) are NULL)", retry_control_handle, retry_action);
        result = MU_FAILURE;
    }
    else
    {
        RETRY_CONTROL_INSTANCE* retry_control = (RETRY_CONTROL_INSTANCE*)retry_control_handle;

        if (retry_control->policy == IOTHUB_CLIENT_RETRY_NONE)
        {
            *retry_action = RETRY_ACTION_STOP_RETRYING;
            result = RESULT_OK;
        }
        else if (retry_control->first_retry_tick_seconds == INDEFINITE_TIME && (retry_control->first_retry_tick_seconds = retry_get_tick_seconds(retry_control_handle)) == INDEFINITE_TIME)
        {
            LogError("Failed to evaluate if retry should be attempted (retry_get_tick_seconds() failed)");
            result = MU_FAILURE;
        }
        else if (evaluate_retry_action(retry_control, retry_action) != RESULT_OK)
        {
            LogError("Failed to evaluate if retry should be attempted (evaluate_retry_action() failed)");
            result = MU_FAILURE;
        }
        else
        {
            if (*retry_action == RETRY_ACTION_RETRY_NOW)
            {
                retry_control->retry_count++;

                if (retry_control->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE)
                {
                    retry_control->last_retry_tick_seconds = retry_get_tick_seconds(retry_control_handle);

                    retry_control->current_wait_time_in_secs = calculate_next_wait_time(retry_control);
                }
            }

            result = RESULT_OK;
        }
    }

    return result;
}